

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.h
# Opt level: O3

void stable_rec_stable_sort(int **arr,size_t L)

{
  int *piVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  int *c;
  int iVar5;
  int L2;
  int **A;
  long lVar6;
  uint L1;
  
  if (1 < L) {
    uVar4 = 1;
    do {
      piVar1 = arr[uVar4 - 1];
      if (*arr[uVar4] < *piVar1) {
        arr[uVar4 - 1] = arr[uVar4];
        arr[uVar4] = piVar1;
      }
      uVar4 = uVar4 + 2;
    } while (uVar4 < L);
    if (L != 2) {
      L1 = 2;
      do {
        uVar2 = L1 * 2;
        uVar3 = (int)L + L1 * -2;
        lVar6 = 0;
        if (-1 < (int)uVar3) {
          lVar6 = 0;
          A = arr;
          do {
            stable_grail_rec_merge(A,L1,L1);
            lVar6 = lVar6 + (int)uVar2;
            A = A + (int)uVar2;
          } while (lVar6 <= (long)(ulong)uVar3);
        }
        iVar5 = (int)L - (int)lVar6;
        L2 = iVar5 - L1;
        if (L2 != 0 && (int)L1 <= iVar5) {
          stable_grail_rec_merge(arr + (int)lVar6,L1,L2);
        }
        L1 = uVar2;
      } while (uVar2 < L);
    }
  }
  return;
}

Assistant:

void REC_STABLE_SORT(SORT_TYPE *arr, size_t L) {
  int m, h, p0, p1, rest;

  for (m = 1; m < L; m += 2) {
    if (SORT_CMP_A(arr + m - 1, arr + m) > 0) {
      GRAIL_SWAP1(arr + (m - 1), arr + m);
    }
  }

  for (h = 2; h < L; h *= 2) {
    p0 = 0;
    p1 = (int)(L - 2 * h);

    while (p0 <= p1) {
      GRAIL_REC_MERGE(arr + p0, h, h);
      p0 += 2 * h;
    }

    rest = (int)(L - p0);

    if (rest > h) {
      GRAIL_REC_MERGE(arr + p0, h, rest - h);
    }
  }
}